

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

Atom writeTargetToProperty(XSelectionRequestEvent *request)

{
  Window WVar1;
  Atom AVar2;
  Atom AVar3;
  Display *pDVar4;
  PFN_XChangeProperty p_Var5;
  unsigned_long uVar6;
  size_t sVar7;
  int local_88;
  int local_84;
  int i_1;
  int j;
  unsigned_long i;
  unsigned_long count;
  Atom *targets_1;
  Atom targets [4];
  Atom AStack_38;
  int formatCount;
  Atom formats [2];
  uchar *local_20;
  char *selectionString;
  XSelectionRequestEvent *request_local;
  
  p_Var5 = _glfw.x11.xlib.ChangeProperty;
  pDVar4 = _glfw.x11.display;
  AStack_38 = _glfw.x11.UTF8_STRING;
  formats[0] = 0x1f;
  if (request->selection == _glfw.x11.PRIMARY) {
    local_20 = (uchar *)_glfw.x11.primarySelectionString;
  }
  else {
    local_20 = (uchar *)_glfw.x11.clipboardString;
  }
  if (request->property == 0) {
    request_local = (XSelectionRequestEvent *)0x0;
  }
  else if (request->target == _glfw.x11.TARGETS) {
    targets_1 = (Atom *)_glfw.x11.TARGETS;
    targets[0] = _glfw.x11.MULTIPLE;
    targets[1] = _glfw.x11.UTF8_STRING;
    targets[2] = 0x1f;
    (*_glfw.x11.xlib.ChangeProperty)
              (_glfw.x11.display,request->requestor,request->property,4,0x20,0,(uchar *)&targets_1,4
              );
    request_local = (XSelectionRequestEvent *)request->property;
  }
  else if (request->target == _glfw.x11.MULTIPLE) {
    uVar6 = _glfwGetWindowPropertyX11
                      (request->requestor,request->property,_glfw.x11.ATOM_PAIR,(uchar **)&count);
    for (_i_1 = 0; p_Var5 = _glfw.x11.xlib.ChangeProperty, pDVar4 = _glfw.x11.display, _i_1 < uVar6;
        _i_1 = _i_1 + 2) {
      local_84 = 0;
      while ((local_84 < 2 &&
             (*(long *)(count + _i_1 * 8) !=
              *(long *)((long)&stack0xffffffffffffffc8 + (long)local_84 * 8)))) {
        local_84 = local_84 + 1;
      }
      if (local_84 < 2) {
        WVar1 = request->requestor;
        AVar2 = *(Atom *)(count + 8 + _i_1 * 8);
        AVar3 = *(Atom *)(count + _i_1 * 8);
        sVar7 = strlen((char *)local_20);
        (*p_Var5)(pDVar4,WVar1,AVar2,AVar3,8,0,local_20,(int)sVar7);
      }
      else {
        *(undefined8 *)(count + 8 + _i_1 * 8) = 0;
      }
    }
    (*_glfw.x11.xlib.ChangeProperty)
              (_glfw.x11.display,request->requestor,request->property,_glfw.x11.ATOM_PAIR,0x20,0,
               (uchar *)count,(int)uVar6);
    (*_glfw.x11.xlib.Free)((void *)count);
    request_local = (XSelectionRequestEvent *)request->property;
  }
  else if (request->target == _glfw.x11.SAVE_TARGETS) {
    (*_glfw.x11.xlib.ChangeProperty)
              (_glfw.x11.display,request->requestor,request->property,_glfw.x11.NULL_,0x20,0,
               (uchar *)0x0,0);
    request_local = (XSelectionRequestEvent *)request->property;
  }
  else {
    for (local_88 = 0; local_88 < 2; local_88 = local_88 + 1) {
      if (request->target == *(Atom *)((long)&stack0xffffffffffffffc8 + (long)local_88 * 8)) {
        WVar1 = request->requestor;
        AVar2 = request->property;
        AVar3 = request->target;
        sVar7 = strlen((char *)local_20);
        (*p_Var5)(pDVar4,WVar1,AVar2,AVar3,8,0,local_20,(int)sVar7);
        return request->property;
      }
    }
    request_local = (XSelectionRequestEvent *)0x0;
  }
  return (Atom)request_local;
}

Assistant:

static Atom writeTargetToProperty(const XSelectionRequestEvent* request)
{
    char* selectionString = NULL;
    const Atom formats[] = { _glfw.x11.UTF8_STRING, XA_STRING };
    const int formatCount = sizeof(formats) / sizeof(formats[0]);

    if (request->selection == _glfw.x11.PRIMARY)
        selectionString = _glfw.x11.primarySelectionString;
    else
        selectionString = _glfw.x11.clipboardString;

    if (request->property == None)
    {
        // The requester is a legacy client (ICCCM section 2.2)
        // We don't support legacy clients, so fail here
        return None;
    }

    if (request->target == _glfw.x11.TARGETS)
    {
        // The list of supported targets was requested

        const Atom targets[] = { _glfw.x11.TARGETS,
                                 _glfw.x11.MULTIPLE,
                                 _glfw.x11.UTF8_STRING,
                                 XA_STRING };

        XChangeProperty(_glfw.x11.display,
                        request->requestor,
                        request->property,
                        XA_ATOM,
                        32,
                        PropModeReplace,
                        (unsigned char*) targets,
                        sizeof(targets) / sizeof(targets[0]));

        return request->property;
    }

    if (request->target == _glfw.x11.MULTIPLE)
    {
        // Multiple conversions were requested

        Atom* targets;
        const unsigned long count =
            _glfwGetWindowPropertyX11(request->requestor,
                                      request->property,
                                      _glfw.x11.ATOM_PAIR,
                                      (unsigned char**) &targets);

        for (unsigned long i = 0;  i < count;  i += 2)
        {
            int j;

            for (j = 0;  j < formatCount;  j++)
            {
                if (targets[i] == formats[j])
                    break;
            }

            if (j < formatCount)
            {
                XChangeProperty(_glfw.x11.display,
                                request->requestor,
                                targets[i + 1],
                                targets[i],
                                8,
                                PropModeReplace,
                                (unsigned char *) selectionString,
                                strlen(selectionString));
            }
            else
                targets[i + 1] = None;
        }

        XChangeProperty(_glfw.x11.display,
                        request->requestor,
                        request->property,
                        _glfw.x11.ATOM_PAIR,
                        32,
                        PropModeReplace,
                        (unsigned char*) targets,
                        count);

        XFree(targets);

        return request->property;
    }

    if (request->target == _glfw.x11.SAVE_TARGETS)
    {
        // The request is a check whether we support SAVE_TARGETS
        // It should be handled as a no-op side effect target

        XChangeProperty(_glfw.x11.display,
                        request->requestor,
                        request->property,
                        _glfw.x11.NULL_,
                        32,
                        PropModeReplace,
                        NULL,
                        0);

        return request->property;
    }

    // Conversion to a data target was requested

    for (int i = 0;  i < formatCount;  i++)
    {
        if (request->target == formats[i])
        {
            // The requested target is one we support

            XChangeProperty(_glfw.x11.display,
                            request->requestor,
                            request->property,
                            request->target,
                            8,
                            PropModeReplace,
                            (unsigned char *) selectionString,
                            strlen(selectionString));

            return request->property;
        }
    }

    // The requested target is not supported

    return None;
}